

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall helics::CommonCore::processQueryCommand(CommonCore *this,ActionMessage *cmd)

{
  int iVar1;
  GlobalFederateId global_fedid;
  _func_int *UNRECOVERED_JUMPTABLE;
  bool bVar2;
  __type_conflict1 _Var3;
  bool bVar4;
  BaseType BVar5;
  route_id rVar6;
  mapped_type *pmVar7;
  string *psVar8;
  FederateState *fed;
  action_t aVar9;
  string_view federateName;
  string_view queryStr;
  string_view queryStr_00;
  string_view queryStr_01;
  string repStr;
  ActionMessage queryResp;
  string local_50;
  
  aVar9 = cmd->messageAction;
  if (aVar9 == cmd_query_reply) {
LAB_00251780:
    global_fedid.gid = (cmd->dest_id).gid;
    if (global_fedid.gid != (this->super_BrokerBase).global_broker_id_local.gid &&
        global_fedid.gid != -0x396fe) {
      rVar6 = getRoute(this,global_fedid);
      UNRECOVERED_JUMPTABLE = (this->super_Core)._vptr_Core[0x6b];
      (*UNRECOVERED_JUMPTABLE)(this,(ulong)(uint)rVar6.rid,cmd,UNRECOVERED_JUMPTABLE);
      return;
    }
    processQueryResponse(this,cmd);
    return;
  }
  bVar4 = false;
  if (aVar9 == cmd_query) {
LAB_002517d6:
    if ((cmd->dest_id).gid == 0) {
      if ((cmd->source_id).gid == -0x396fe) {
        if ((this->queryTimeouts).
            super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            (this->queryTimeouts).
            super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur) {
          BrokerBase::setTickForwarding(&this->super_BrokerBase,QUERY_TIMEOUT,true);
        }
        queryResp._0_8_ = std::chrono::_V2::steady_clock::now();
        std::
        deque<std::pair<int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>>>
        ::
        emplace_back<int&,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                  ((deque<std::pair<int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>>>
                    *)&this->queryTimeouts,&cmd->messageID,
                   (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)&queryResp);
      }
      psVar8 = ActionMessage::getString_abi_cxx11_(cmd,0);
      bVar2 = std::operator==(psVar8,"root");
      if ((bVar2) || (bVar2 = std::operator==(psVar8,"federation"), bVar2)) {
        aVar9 = cmd_broker_query;
        if (bVar4 != false) {
          aVar9 = cmd_broker_query_ordered;
        }
        ActionMessage::setAction(cmd,aVar9);
        BVar5 = 1;
      }
      else {
        bVar2 = std::operator==(psVar8,"parent");
        if ((!bVar2) && (bVar2 = std::operator==(psVar8,"broker"), !bVar2)) goto LAB_00251971;
        aVar9 = cmd_broker_query;
        if (bVar4 != false) {
          aVar9 = cmd_broker_query_ordered;
        }
        ActionMessage::setAction(cmd,aVar9);
        BVar5 = (this->super_BrokerBase).higher_broker_id.gid;
      }
      (cmd->dest_id).gid = BVar5;
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&cmd->stringData);
LAB_00251971:
      iVar1 = (this->super_BrokerBase).global_broker_id_local.gid;
      if (iVar1 != 0) {
        (cmd->source_id).gid = iVar1;
        (*(this->super_Core)._vptr_Core[0x6c])(this,0,cmd);
        return;
      }
      (cmd->source_id).gid = -0x396fe;
      gmlc::containers::SimpleQueue<helics::ActionMessage,_std::mutex>::push<helics::ActionMessage>
                (&this->delayTransmitQueue,cmd);
      return;
    }
    repStr._M_dataplus._M_p = (pointer)&repStr.field_2;
    repStr._M_string_length = 0;
    repStr.field_2._M_local_buf[0] = '\0';
    aVar9 = cmd_query_reply;
    if (bVar4 != false) {
      aVar9 = cmd_query_reply_ordered;
    }
    ActionMessage::ActionMessage(&queryResp,aVar9);
    queryResp.dest_id.gid = (cmd->source_id).gid;
    queryResp.source_id.gid = (cmd->dest_id).gid;
    queryResp.messageID = cmd->messageID;
    queryResp.counter = cmd->counter;
    psVar8 = ActionMessage::getString_abi_cxx11_(cmd,0);
    _Var3 = std::operator==(psVar8,&(this->super_BrokerBase).identifier);
    if (_Var3) {
      queryResp.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
      queryStr_00._M_str = (char *)(cmd->payload).heap;
      queryStr_00._M_len = (cmd->payload).bufferSize;
      coreQuery_abi_cxx11_(&local_50,this,queryStr_00,bVar4);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&repStr,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      federateName._M_str = (psVar8->_M_dataplus)._M_p;
      federateName._M_len = psVar8->_M_string_length;
      fed = getFederateCore(this,federateName);
      queryStr_01._M_str = (char *)(cmd->payload).heap;
      queryStr_01._M_len = (cmd->payload).bufferSize;
      federateQuery_abi_cxx11_(&local_50,this,fed,queryStr_01,bVar4);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&repStr,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &repStr,"#wait");
      if (bVar4) {
        if (fed != (FederateState *)0x0) {
          (cmd->dest_id).gid = (fed->global_id)._M_i.gid;
          FederateState::addAction(fed,cmd);
          goto LAB_00251b68;
        }
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&repStr,
                   "#error");
      }
    }
    SmallBuffer::operator=(&queryResp.payload,&repStr);
    if (queryResp.dest_id.gid == -0x396fe) {
      processQueryResponse(this,&queryResp);
    }
    else {
      rVar6 = getRoute(this,queryResp.dest_id);
      (*(this->super_Core)._vptr_Core[0x6b])(this,(ulong)(uint)rVar6.rid,&queryResp);
    }
  }
  else {
    if (aVar9 != cmd_broker_query) {
      if (aVar9 == cmd_query_ordered) {
        bVar4 = true;
        goto LAB_002517d6;
      }
      if (aVar9 == cmd_query_reply_ordered) goto LAB_00251780;
      if (aVar9 != cmd_broker_query_ordered) {
        return;
      }
      bVar4 = true;
    }
    iVar1 = (cmd->dest_id).gid;
    if (iVar1 != (this->super_BrokerBase).global_broker_id_local.gid && iVar1 != -0x396fe) {
      routeMessage(this,cmd);
      return;
    }
    queryStr._M_str = (char *)(cmd->payload).heap;
    queryStr._M_len = (cmd->payload).bufferSize;
    coreQuery_abi_cxx11_(&repStr,this,queryStr,bVar4);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &repStr,"#wait");
    iVar1 = (cmd->source_id).gid;
    if (bVar2) {
      if (iVar1 == -0x396fe) {
        if ((this->queryTimeouts).
            super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            (this->queryTimeouts).
            super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur) {
          BrokerBase::setTickForwarding(&this->super_BrokerBase,QUERY_TIMEOUT,true);
        }
        queryResp._0_8_ = std::chrono::_V2::steady_clock::now();
        std::
        deque<std::pair<int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>>>
        ::
        emplace_back<int&,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                  ((deque<std::pair<int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>>>
                    *)&this->queryTimeouts,&cmd->messageID,
                   (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)&queryResp);
      }
      aVar9 = cmd_query_reply;
      if (bVar4 != false) {
        aVar9 = cmd_query_reply_ordered;
      }
      ActionMessage::ActionMessage(&queryResp,aVar9);
      queryResp.dest_id.gid = (cmd->source_id).gid;
      queryResp.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
      queryResp.messageID = cmd->messageID;
      queryResp.counter = cmd->counter;
      local_50._M_dataplus._M_p = (pointer)(cmd->payload).bufferSize;
      local_50._M_string_length = (size_type)(cmd->payload).heap;
      pmVar7 = std::
               map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>_>_>
               ::at((map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>_>_>
                     *)mapIndex,(key_type *)&local_50);
      std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::push_back
                (&(this->mapBuilders).
                  super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[pmVar7->first].
                  super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                  .
                  super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                  .
                  super__Head_base<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_false>
                  ._M_head_impl,&queryResp);
    }
    else {
      if (iVar1 == -0x396fe) {
        gmlc::concurrency::
        DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::setDelayedValue(&this->activeQueries,cmd->messageID,&repStr);
        goto LAB_00251b72;
      }
      aVar9 = cmd_query_reply;
      if (bVar4 != false) {
        aVar9 = cmd_query_reply_ordered;
      }
      ActionMessage::ActionMessage(&queryResp,aVar9);
      queryResp.dest_id.gid = (cmd->source_id).gid;
      queryResp.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
      queryResp.messageID = cmd->messageID;
      SmallBuffer::operator=(&queryResp.payload,&repStr);
      queryResp.counter = cmd->counter;
      rVar6 = getRoute(this,queryResp.dest_id);
      (*(this->super_Core)._vptr_Core[0x6b])(this,(ulong)(uint)rVar6.rid,&queryResp);
    }
  }
LAB_00251b68:
  ActionMessage::~ActionMessage(&queryResp);
LAB_00251b72:
  std::__cxx11::string::~string((string *)&repStr);
  return;
}

Assistant:

void CommonCore::processQueryCommand(ActionMessage& cmd)
{
    bool force_ordered{false};
    switch (cmd.action()) {
        case CMD_BROKER_QUERY_ORDERED:
            force_ordered = true;
            [[fallthrough]];
        case CMD_BROKER_QUERY:

            if (cmd.dest_id == global_broker_id_local || cmd.dest_id == gDirectCoreId) {
                std::string repStr = coreQuery(cmd.payload.to_string(), force_ordered);
                if (repStr != "#wait") {
                    if (cmd.source_id == gDirectCoreId) {
                        activeQueries.setDelayedValue(cmd.messageID, std::move(repStr));
                    } else {
                        ActionMessage queryResp(force_ordered ? CMD_QUERY_REPLY_ORDERED :
                                                                CMD_QUERY_REPLY);
                        queryResp.dest_id = cmd.source_id;
                        queryResp.source_id = global_broker_id_local;
                        queryResp.messageID = cmd.messageID;
                        queryResp.payload = std::move(repStr);
                        queryResp.counter = cmd.counter;
                        transmit(getRoute(queryResp.dest_id), queryResp);
                    }
                } else {
                    if (cmd.source_id == gDirectCoreId) {
                        if (queryTimeouts.empty()) {
                            setTickForwarding(TickForwardingReasons::QUERY_TIMEOUT, true);
                        }
                        queryTimeouts.emplace_back(cmd.messageID, std::chrono::steady_clock::now());
                    }
                    ActionMessage queryResp(force_ordered ? CMD_QUERY_REPLY_ORDERED :
                                                            CMD_QUERY_REPLY);
                    queryResp.dest_id = cmd.source_id;
                    queryResp.source_id = global_broker_id_local;
                    queryResp.messageID = cmd.messageID;
                    queryResp.counter = cmd.counter;
                    std::get<1>(mapBuilders[mapIndex.at(cmd.payload.to_string()).first])
                        .push_back(queryResp);
                }

            } else {
                routeMessage(std::move(cmd));
            }
            break;
        case CMD_QUERY_ORDERED:
            force_ordered = true;
            [[fallthrough]];
        case CMD_QUERY:
            if (cmd.dest_id == parent_broker_id) {
                if (cmd.source_id == gDirectCoreId) {
                    if (queryTimeouts.empty()) {
                        setTickForwarding(TickForwardingReasons::QUERY_TIMEOUT, true);
                    }
                    queryTimeouts.emplace_back(cmd.messageID, std::chrono::steady_clock::now());
                }
                const auto& target = cmd.getString(targetStringLoc);
                if (target == "root" || target == "federation") {
                    cmd.setAction(force_ordered ? CMD_BROKER_QUERY_ORDERED : CMD_BROKER_QUERY);
                    cmd.dest_id = gRootBrokerID;
                    cmd.clearStringData();
                } else if (target == "parent" || target == "broker") {
                    cmd.setAction(force_ordered ? CMD_BROKER_QUERY_ORDERED : CMD_BROKER_QUERY);
                    cmd.dest_id = higher_broker_id;
                    cmd.clearStringData();
                }
                if (global_broker_id_local != parent_broker_id) {
                    // forward on to Broker
                    cmd.source_id = global_broker_id_local;
                    transmit(parent_route_id, std::move(cmd));
                } else {
                    // this will get processed when this core is assigned a global hid
                    cmd.source_id = gDirectCoreId;
                    delayTransmitQueue.push(std::move(cmd));
                }
            } else {
                std::string repStr;
                ActionMessage queryResp(force_ordered ? CMD_QUERY_REPLY_ORDERED : CMD_QUERY_REPLY);
                queryResp.dest_id = cmd.source_id;
                queryResp.source_id = cmd.dest_id;
                queryResp.messageID = cmd.messageID;
                queryResp.counter = cmd.counter;
                const std::string& target = cmd.getString(targetStringLoc);
                if (target == getIdentifier()) {
                    queryResp.source_id = global_broker_id_local;
                    repStr = coreQuery(cmd.payload.to_string(), force_ordered);
                } else {
                    auto* fedptr = getFederateCore(target);
                    repStr = federateQuery(fedptr, cmd.payload.to_string(), force_ordered);
                    if (repStr == "#wait") {
                        if (fedptr != nullptr) {
                            cmd.dest_id = fedptr->global_id;
                            fedptr->addAction(std::move(cmd));
                            break;
                        }
                        repStr = "#error";
                    }
                }

                queryResp.payload = std::move(repStr);
                if (queryResp.dest_id == gDirectCoreId) {
                    processQueryResponse(queryResp);
                } else {
                    transmit(getRoute(queryResp.dest_id), queryResp);
                }
            }
            break;
        case CMD_QUERY_REPLY:
        case CMD_QUERY_REPLY_ORDERED:
            if (cmd.dest_id == global_broker_id_local || cmd.dest_id == gDirectCoreId) {
                processQueryResponse(cmd);
            } else {
                transmit(getRoute(cmd.dest_id), cmd);
            }
            break;
        default:
            break;
    }
}